

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::GetThisFromModuleRoot(Var thisVar)

{
  HostObjectBase *pHVar1;
  RecyclableObject *hostObject;
  RootObjectBase *rootObject;
  Var thisVar_local;
  
  pHVar1 = RootObjectBase::GetHostObject((RootObjectBase *)thisVar);
  rootObject = (RootObjectBase *)thisVar;
  if (pHVar1 != (HostObjectBase *)0x0) {
    rootObject = (RootObjectBase *)(**(code **)(*(long *)pHVar1 + 0x2b8))();
  }
  return rootObject;
}

Assistant:

Var JavascriptOperators::GetThisFromModuleRoot(Var thisVar)
    {
        RootObjectBase * rootObject = static_cast<RootObjectBase*>(thisVar);
        RecyclableObject* hostObject = rootObject->GetHostObject();

        //
        // if the module root has the host object, use that as "this"
        //
        if (hostObject)
        {
            thisVar = hostObject->GetHostDispatchVar();
        }
        return thisVar;
    }